

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O3

void * tc_malloc_skip_new_handler(size_t size)

{
  byte bVar1;
  ThreadCache *this;
  undefined8 *p;
  sbyte sVar2;
  FreeList *pFVar3;
  int iVar4;
  uint uVar5;
  size_t in_RSI;
  long in_FS_OFFSET;
  ThreadCachePtr TVar6;
  
  this = *(ThreadCache **)(in_FS_OFFSET + -8);
  if (this == (ThreadCache *)0x0) {
    TVar6 = tcmalloc::ThreadCachePtr::GetSlow();
    this = TVar6.ptr_;
  }
  if (size < 0x401) {
    sVar2 = 3;
    iVar4 = 7;
  }
  else {
    if (0x40000 < size) {
      p = (undefined8 *)anon_unknown.dwarf_16b90::do_malloc_pages((ThreadCache *)size,in_RSI);
      goto LAB_0010fb77;
    }
    sVar2 = 7;
    iVar4 = 0x3c7f;
  }
  bVar1 = (&tcmalloc::Static::sizemap_)[(uint)(iVar4 + (int)size) >> sVar2];
  iVar4 = this->list_[bVar1].size_;
  p = (undefined8 *)this->list_[bVar1].list_;
  if (p == (undefined8 *)0x0) {
    p = (undefined8 *)
        tcmalloc::ThreadCache::FetchFromCentralCache
                  (this,(uint)bVar1,iVar4,anon_unknown.dwarf_16b90::nop_oom_handler);
  }
  else {
    pFVar3 = this->list_ + bVar1;
    pFVar3->list_ = (void *)*p;
    uVar5 = pFVar3->length_ - 1;
    pFVar3->length_ = uVar5;
    if (uVar5 < pFVar3->lowater_) {
      pFVar3->lowater_ = uVar5;
    }
    this->size_ = this->size_ - iVar4;
  }
LAB_0010fb77:
  if (base::internal::new_hooks_ != 0) {
    tcmalloc::InvokeNewHookSlow(p,size);
  }
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_malloc_skip_new_handler(size_t size)  PERFTOOLS_NOTHROW {
  void* result = do_malloc(size);
  tcmalloc::InvokeNewHook(result, size);
  return result;
}